

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profiler.h
# Opt level: O2

void __thiscall Assimp::Profiling::Profiler::BeginRegion(Profiler *this,string *region)

{
  rep rVar1;
  mapped_type *pmVar2;
  Logger *this_00;
  char *local_1b0 [4];
  ostream local_190 [376];
  
  rVar1 = std::chrono::_V2::system_clock::now();
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
           ::operator[](&this->regions,region);
  (pmVar2->__d).__r = rVar1;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[8]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (char (*) [8])"START `");
  std::operator<<(local_190,(string *)region);
  std::operator<<(local_190,"`");
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void BeginRegion(const std::string& region) {
        regions[region] = std::chrono::system_clock::now();
        ASSIMP_LOG_DEBUG((format("START `"),region,"`"));
    }